

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

Atom * __thiscall Potassco::SmodelsConvert::SmData::mapAtom(SmData *this,Atom_t a)

{
  uint uVar1;
  pointer pAVar2;
  ulong uVar3;
  
  uVar3 = (ulong)a;
  pAVar2 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->atoms_).
                            super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 2)) {
    if (((uint)pAVar2[uVar3] & 0xfffffff) != 0) goto LAB_0010fa7d;
  }
  else {
    std::
    vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
    ::resize(&this->atoms_,(ulong)(a + 1));
    pAVar2 = (this->atoms_).
             super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar1 = this->next_;
  this->next_ = uVar1 + 1;
  pAVar2[uVar3] = (Atom)((uint)pAVar2[uVar3] & 0xf0000000 | uVar1 & 0xfffffff);
  pAVar2 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_0010fa7d:
  return pAVar2 + uVar3;
}

Assistant:

Atom&  mapAtom(Atom_t a) {
		if (mapped(a)) { return atoms_[a]; }
		if (a >= atoms_.size()) { atoms_.resize(a + 1); }
		atoms_[a].smId = next_++;
		return atoms_[a];
	}